

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

Var Js::JavascriptString::StringBracketHelper
              (Arguments *args,ScriptContext *scriptContext,char16 *pszTag,charcount_t cchTag,
              char16 *pszProp,charcount_t cchProp)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  charcount_t rhs;
  uint32 uVar4;
  uint uVar5;
  uint uVar6;
  ScriptConfiguration *this;
  Var pvVar7;
  JavascriptLibrary *this_00;
  char16_t *pcVar8;
  undefined4 *puVar9;
  char16 *pcVar10;
  char16 *pcVar11;
  JavascriptString *pJVar12;
  char16 *pcVar13;
  char16_t local_112;
  char16_t local_d0;
  char16_t local_ce;
  JavascriptString *local_c8;
  JavascriptString *local_c0;
  char16 *pThisString;
  char16 *pcStack_a0;
  charcount_t destLengthLeft;
  char16 *pResult;
  BufferStringBuilder builder;
  bool ES6FixesEnabled;
  charcount_t quotStrLen;
  undefined8 uStack_82;
  char16 quotStr [7];
  uint quotesCount;
  char16 *propertyValueStr;
  JavascriptString *pPropertyValue;
  JavascriptString *pThis;
  uint32 local_50;
  charcount_t ich;
  charcount_t cchTotalChars;
  charcount_t cchPropertyValue;
  charcount_t cchThis;
  charcount_t cchProp_local;
  char16 *pszProp_local;
  charcount_t cchTag_local;
  char16 *pszTag_local;
  ScriptContext *scriptContext_local;
  Arguments *args_local;
  
  stack0xffffffffffffff90 = (char16 *)0x0;
  quotStr[3] = L'\0';
  quotStr[4] = L'\0';
  uStack_82 = 0x6f007500710026;
  quotStr[0] = L't';
  quotStr[1] = L';';
  quotStr[2] = L'\0';
  this = ScriptContext::GetConfig(scriptContext);
  builder.m_string._7_1_ = ScriptConfiguration::IsES6StringPrototypeFixEnabled(this);
  if (((ulong)args->Info & 0xffffff) == 0) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec73,(PCWSTR)0x0);
  }
  if ((bool)builder.m_string._7_1_) {
    pvVar7 = Arguments::operator[](args,0);
    BVar3 = JavascriptConversion::CheckObjectCoercible(pvVar7,scriptContext);
    if (BVar3 == 0) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec42,pszTag);
    }
  }
  pvVar7 = Arguments::operator[](args,0);
  bVar2 = VarIs<Js::JavascriptString>(pvVar7);
  if (bVar2) {
    local_c0 = UnsafeVarTo<Js::JavascriptString>(pvVar7);
  }
  else {
    local_c0 = (JavascriptString *)0x0;
  }
  pPropertyValue = local_c0;
  if (local_c0 == (JavascriptString *)0x0) {
    pvVar7 = Arguments::operator[](args,0);
    pPropertyValue = JavascriptConversion::ToString(pvVar7,scriptContext);
  }
  rhs = GetLength(pPropertyValue);
  uVar4 = UInt32Math::Add(cchTag,cchTag);
  local_50 = UInt32Math::Add(uVar4,5);
  if (pszProp == (char16 *)0x0) {
    ich = 0;
    cchPropertyValue = 0;
  }
  else {
    if ((SUB84(args->Info,0) & 0xffffff) < 2) {
      this_00 = ScriptContext::GetLibrary(scriptContext);
      propertyValueStr = (char16 *)JavascriptLibrary::GetUndefinedDisplayString(this_00);
    }
    else {
      pvVar7 = Arguments::operator[](args,1);
      bVar2 = VarIs<Js::JavascriptString>(pvVar7);
      if (bVar2) {
        local_c8 = UnsafeVarTo<Js::JavascriptString>(pvVar7);
      }
      else {
        local_c8 = (JavascriptString *)0x0;
      }
      propertyValueStr = (char16 *)local_c8;
      if (local_c8 == (JavascriptString *)0x0) {
        pvVar7 = Arguments::operator[](args,1);
        propertyValueStr = (char16 *)JavascriptConversion::ToString(pvVar7,scriptContext);
      }
    }
    ich = GetLength((JavascriptString *)propertyValueStr);
    register0x00000000 = GetString((JavascriptString *)propertyValueStr);
    if ((builder.m_string._7_1_ & 1) != 0) {
      for (pThis._4_4_ = 0; pThis._4_4_ < ich; pThis._4_4_ = pThis._4_4_ + 1) {
        if (register0x00000000[pThis._4_4_] == L'\"') {
          quotStr._6_4_ = quotStr._6_4_ + 1;
        }
      }
    }
    uVar4 = UInt32Math::Add(local_50,cchProp);
    local_50 = UInt32Math::Add(uVar4,4);
    cchPropertyValue = cchProp;
    if ((builder.m_string._7_1_ & 1) != 0) {
      uVar4 = UInt32Math::Mul(quotStr._6_4_,6);
      local_50 = UInt32Math::Add(local_50,uVar4);
      local_50 = local_50 - quotStr._6_4_;
    }
  }
  uVar4 = UInt32Math::Add(local_50,rhs);
  uVar4 = UInt32Math::Add(uVar4,ich);
  bVar2 = IsValidCharCount((ulong)uVar4);
  if (((!bVar2) || (uVar4 < rhs)) || (uVar4 < ich)) {
    JavascriptError::ThrowOutOfMemoryError(scriptContext);
  }
  BufferStringBuilder::BufferStringBuilder((BufferStringBuilder *)&pResult,uVar4,scriptContext);
  pcVar8 = BufferStringBuilder::DangerousGetWritableBuffer((BufferStringBuilder *)&pResult);
  *pcVar8 = L'<';
  for (pThis._4_4_ = 0; pcStack_a0 = pcVar8 + 1, pThis._4_4_ < cchTag; pThis._4_4_ = pThis._4_4_ + 1
      ) {
    if ((builder.m_string._7_1_ & 1) == 0) {
      local_ce = PAL_towupper(pszTag[pThis._4_4_]);
    }
    else {
      local_ce = pszTag[pThis._4_4_];
    }
    *pcStack_a0 = local_ce;
    pcVar8 = pcStack_a0;
  }
  if (pszProp != (char16 *)0x0) {
    *pcStack_a0 = L' ';
    pcStack_a0 = pcVar8 + 2;
    for (pThis._4_4_ = 0; pThis._4_4_ < cchPropertyValue; pThis._4_4_ = pThis._4_4_ + 1) {
      if ((builder.m_string._7_1_ & 1) == 0) {
        local_d0 = PAL_towupper(pszProp[pThis._4_4_]);
      }
      else {
        local_d0 = pszProp[pThis._4_4_];
      }
      *pcStack_a0 = local_d0;
      pcStack_a0 = pcStack_a0 + 1;
    }
    pcVar8 = pcStack_a0 + 1;
    *pcStack_a0 = L'=';
    pcStack_a0 = pcStack_a0 + 2;
    *pcVar8 = L'\"';
    if (stack0xffffffffffffff90 == (char16 *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                  ,0xd28,"(propertyValueStr != nullptr)",
                                  "propertyValueStr != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    if (((builder.m_string._7_1_ & 1) == 0) || (quotStr._6_4_ == 0)) {
      pcVar10 = BufferStringBuilder::DangerousGetWritableBuffer((BufferStringBuilder *)&pResult);
      js_wmemcpy_s(pcStack_a0,(ulong)uVar4 - (((long)pcStack_a0 - (long)pcVar10 >> 1) + 1),
                   stack0xffffffffffffff90,(ulong)ich);
      pcStack_a0 = pcStack_a0 + ich;
    }
    else {
      for (pThis._4_4_ = 0; pThis._4_4_ < ich; pThis._4_4_ = pThis._4_4_ + 1) {
        if (stack0xffffffffffffff90[pThis._4_4_] == L'\"') {
          pcVar10 = BufferStringBuilder::DangerousGetWritableBuffer((BufferStringBuilder *)&pResult)
          ;
          uVar5 = uVar4 - ((int)((long)pcStack_a0 - (long)pcVar10 >> 1) + 1);
          js_wmemcpy_s(pcStack_a0,(ulong)uVar5,(char16 *)&stack0xffffffffffffff7e,6);
          pcStack_a0 = pcStack_a0 + 6;
          quotStr._6_4_ = quotStr._6_4_ + -1;
          if (quotStr._6_4_ == 0) {
            uVar6 = pThis._4_4_ + 1;
            js_wmemcpy_s(pcStack_a0,(ulong)(uVar5 - 6),stack0xffffffffffffff90 + uVar6,
                         (ulong)(ich - uVar6));
            pcStack_a0 = pcStack_a0 + (ich - uVar6);
            break;
          }
        }
        else {
          *pcStack_a0 = stack0xffffffffffffff90[pThis._4_4_];
          pcStack_a0 = pcStack_a0 + 1;
        }
      }
    }
    *pcStack_a0 = L'\"';
    pcStack_a0 = pcStack_a0 + 1;
  }
  pcVar13 = pcStack_a0 + 1;
  *pcStack_a0 = L'>';
  pcVar10 = GetString(pPropertyValue);
  pcVar11 = BufferStringBuilder::DangerousGetWritableBuffer((BufferStringBuilder *)&pResult);
  js_wmemcpy_s(pcVar13,(ulong)uVar4 - (((long)pcVar13 - (long)pcVar11 >> 1) + 1),pcVar10,(ulong)rhs)
  ;
  pcVar13 = pcVar13 + rhs;
  *pcVar13 = L'<';
  pcVar13[1] = L'/';
  pcStack_a0 = pcVar13 + 2;
  for (pThis._4_4_ = 0; pThis._4_4_ < cchTag; pThis._4_4_ = pThis._4_4_ + 1) {
    if ((builder.m_string._7_1_ & 1) == 0) {
      local_112 = PAL_towupper(pszTag[pThis._4_4_]);
    }
    else {
      local_112 = pszTag[pThis._4_4_];
    }
    *pcStack_a0 = local_112;
    pcStack_a0 = pcStack_a0 + 1;
  }
  *pcStack_a0 = L'>';
  pcVar10 = BufferStringBuilder::DangerousGetWritableBuffer((BufferStringBuilder *)&pResult);
  if ((uint32)((long)pcStack_a0 + (2 - (long)pcVar10) >> 1) != uVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xd71,
                                "((charcount_t)(pResult - builder.DangerousGetWritableBuffer()) == cchTotalChars)"
                                ,"Exceeded allocated string limit");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  pJVar12 = BufferStringBuilder::ToString((BufferStringBuilder *)&pResult);
  return pJVar12;
}

Assistant:

Var JavascriptString::StringBracketHelper(Arguments args, ScriptContext *scriptContext, __in_ecount(cchTag) char16 const *pszTag,
                                                charcount_t cchTag, __in_ecount_opt(cchProp) char16 const *pszProp, charcount_t cchProp)
    {
        charcount_t cchThis;
        charcount_t cchPropertyValue;
        charcount_t cchTotalChars;
        charcount_t ich;
        JavascriptString * pThis = nullptr;
        JavascriptString * pPropertyValue = nullptr;
        const char16 * propertyValueStr = nullptr;
        uint quotesCount = 0;
        const char16 quotStr[] = _u("&quot;");
        const charcount_t quotStrLen = _countof(quotStr) - 1;
        bool ES6FixesEnabled = scriptContext->GetConfig()->IsES6StringPrototypeFixEnabled();

        // Assemble the component pieces of a string tag function (ex: String.prototype.link).
        // In the general case, result is as below:
        //
        // pszProp = _u("href");
        // pszTag = _u("a");
        // pThis = VarTo<JavascriptString>(args[0]);
        // pPropertyValue = VarTo<JavascriptString>(args[1]);
        //
        // pResult = _u("<a href=\"[[pPropertyValue]]\">[[pThis]]</a>");
        //
        // cchTotalChars = 5                    // <></>
        //                 + cchTag * 2         // a
        //                 + cchProp            // href
        //                 + 4                  // _=""
        //                 + cchPropertyValue
        //                 + cchThis;
        //
        // Note: With ES6FixesEnabled, we need to escape quote characters (_u('"')) in pPropertyValue.
        // Note: Without ES6FixesEnabled, the tag and prop strings should be capitalized.

        if(args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedString);
        }

        if (ES6FixesEnabled)
        {
            if (!JavascriptConversion::CheckObjectCoercible(args[0], scriptContext))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, pszTag);
            }
        }

        pThis = JavascriptOperators::TryFromVar<JavascriptString>(args[0]);
        if (!pThis)
        {
            pThis = JavascriptConversion::ToString(args[0], scriptContext);
        }

        cchThis = pThis->GetLength();
        cchTotalChars = UInt32Math::Add(cchTag, cchTag);

        // 5 is for the <></> characters
        cchTotalChars = UInt32Math::Add(cchTotalChars, 5);

        if (nullptr != pszProp)
        {
            // Need one string argument.
            if (args.Info.Count >= 2)
            {
                pPropertyValue = JavascriptOperators::TryFromVar<JavascriptString>(args[1]);
                if (!pPropertyValue)
                {
                    pPropertyValue = JavascriptConversion::ToString(args[1], scriptContext);
                }
            }
            else
            {
                pPropertyValue = scriptContext->GetLibrary()->GetUndefinedDisplayString();
            }

            cchPropertyValue = pPropertyValue->GetLength();
            propertyValueStr = pPropertyValue->GetString();

            if (ES6FixesEnabled)
            {
                // Count the number of " characters we need to escape.
                for (ich = 0; ich < cchPropertyValue; ich++)
                {
                    if (propertyValueStr[ich] == _u('"'))
                    {
                        ++quotesCount;
                    }
                }
            }

            cchTotalChars = UInt32Math::Add(cchTotalChars, cchProp);

            // 4 is for the _="" characters
            cchTotalChars = UInt32Math::Add(cchTotalChars, 4);

            if (ES6FixesEnabled)
            {
                // Account for the " escaping (&quot;)
                cchTotalChars = UInt32Math::Add(cchTotalChars, UInt32Math::Mul(quotesCount, quotStrLen)) - quotesCount;
            }
        }
        else
        {
            cchPropertyValue = 0;
            cchProp = 0;
        }
        cchTotalChars = UInt32Math::Add(cchTotalChars, cchThis);
        cchTotalChars = UInt32Math::Add(cchTotalChars, cchPropertyValue);
        if (!IsValidCharCount(cchTotalChars) || cchTotalChars < cchThis || cchTotalChars < cchPropertyValue)
        {
            Js::JavascriptError::ThrowOutOfMemoryError(scriptContext);
        }

        BufferStringBuilder builder(cchTotalChars, scriptContext);
        char16 *pResult = builder.DangerousGetWritableBuffer();

        *pResult++ = _u('<');
        for (ich = 0; ich < cchTag; ich++)
        {
            *pResult++ = ES6FixesEnabled ? pszTag[ich] : towupper(pszTag[ich]);
        }
        if (nullptr != pszProp)
        {
            *pResult++ = _u(' ');
            for (ich = 0; ich < cchProp; ich++)
            {
                *pResult++ = ES6FixesEnabled ? pszProp[ich] : towupper(pszProp[ich]);
            }
            *pResult++ = _u('=');
            *pResult++ = _u('"');

            Assert(propertyValueStr != nullptr);

            if (!ES6FixesEnabled || quotesCount == 0)
            {
                js_wmemcpy_s(pResult,
                    cchTotalChars - (pResult - builder.DangerousGetWritableBuffer() + 1),
                    propertyValueStr,
                    cchPropertyValue);

                pResult += cchPropertyValue;
            }
            else {
                for (ich = 0; ich < cchPropertyValue; ich++)
                {
                    if (propertyValueStr[ich] == _u('"'))
                    {
                        charcount_t destLengthLeft = (cchTotalChars - (charcount_t)(pResult - builder.DangerousGetWritableBuffer() + 1));

                        // Copy the quote string into result beginning at the index where the quote would appear
                        js_wmemcpy_s(pResult,
                            destLengthLeft,
                            quotStr,
                            quotStrLen);

                        // Move result ahead by the length of the quote string
                        pResult += quotStrLen;
                        // We ate one of the quotes
                        quotesCount--;

                        // We only need to check to see if we have no more quotes after eating a quote
                        if (quotesCount == 0)
                        {
                            // Skip the quote character.
                            // Note: If ich is currently the last character (cchPropertyValue-1), it becomes cchPropertyValue after incrementing.
                            // At that point, cchPropertyValue - ich == 0 so we will not increment pResult and will call memcpy for zero bytes.
                            ich++;

                            // Copy the rest from the property value string starting at the index after the last quote
                            js_wmemcpy_s(pResult,
                                destLengthLeft - quotStrLen,
                                propertyValueStr + ich,
                                cchPropertyValue - ich);

                            // Move result ahead by the length of the rest of the property string
                            pResult += (cchPropertyValue - ich);
                            break;
                        }
                    }
                    else
                    {
                        // Each non-quote character just gets copied into result string
                        *pResult++ = propertyValueStr[ich];
                    }
                }
            }

            *pResult++ = _u('"');
        }
        *pResult++ = _u('>');

        const char16 *pThisString = pThis->GetString();
        js_wmemcpy_s(pResult, cchTotalChars - (pResult - builder.DangerousGetWritableBuffer() + 1), pThisString, cchThis);
        pResult += cchThis;

        *pResult++ = _u('<');
        *pResult++ = _u('/');
        for (ich = 0; ich < cchTag; ich++)
        {
            *pResult++ = ES6FixesEnabled ? pszTag[ich] : towupper(pszTag[ich]);
        }
        *pResult++ = _u('>');

        // Assert we ended at the right place.
        AssertMsg((charcount_t)(pResult - builder.DangerousGetWritableBuffer()) == cchTotalChars, "Exceeded allocated string limit");

        return builder.ToString();
    }